

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# productquantizer.cc
# Opt level: O1

void __thiscall
fasttext::ProductQuantizer::addcode
          (ProductQuantizer *this,Vector *x,uint8_t *codes,int32_t t,real alpha)

{
  int iVar1;
  int iVar2;
  undefined1 auVar3 [16];
  real *prVar4;
  ulong uVar5;
  pointer pfVar6;
  ulong uVar7;
  ulong uVar8;
  
  iVar1 = this->nsubq_;
  if (0 < (long)iVar1) {
    iVar2 = this->dsub_;
    pfVar6 = (x->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = 0;
    uVar7 = (long)iVar2;
    do {
      prVar4 = get_centroids(this,(int32_t)uVar8,codes[uVar8 + (long)(t * iVar1)]);
      if (uVar8 == iVar1 - 1) {
        uVar7 = (ulong)(uint)this->lastdsub_;
      }
      if (0 < (int)uVar7) {
        uVar5 = 0;
        do {
          auVar3 = vfmadd213ss_fma(ZEXT416((uint)prVar4[uVar5]),ZEXT416((uint)alpha),
                                   ZEXT416((uint)pfVar6[uVar5]));
          pfVar6[uVar5] = auVar3._0_4_;
          uVar5 = uVar5 + 1;
        } while ((uVar7 & 0xffffffff) != uVar5);
      }
      uVar8 = uVar8 + 1;
      pfVar6 = pfVar6 + iVar2;
    } while (uVar8 != (long)iVar1);
  }
  return;
}

Assistant:

void ProductQuantizer::addcode(
    Vector& x,
    const uint8_t* codes,
    int32_t t,
    real alpha) const {
  auto d = dsub_;
  const uint8_t* code = codes + nsubq_ * t;
  for (auto m = 0; m < nsubq_; m++) {
    const real* c = get_centroids(m, code[m]);
    if (m == nsubq_ - 1) {
      d = lastdsub_;
    }
    for (auto n = 0; n < d; n++) {
      x[m * dsub_ + n] += alpha * c[n];
    }
  }
}